

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

CURLcode mqtt_doing(Curl_easy *data,_Bool *done)

{
  curl_socket_t cVar1;
  smb_conn_state sVar2;
  uint uVar3;
  MQTT *pMVar4;
  char *pcVar5;
  char *buf;
  connectdata *pcVar6;
  SMTP *pSVar7;
  byte bVar8;
  CURLcode CVar9;
  CURLcode CVar10;
  connectdata *conn_2;
  curl_slist *sizerequested;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  curl_socket_t sockfd;
  connectdata *conn;
  curl_slist *size;
  bool bVar14;
  uchar byte;
  ssize_t nread;
  byte local_4b;
  byte local_4a;
  char local_49;
  size_t local_48;
  _Bool *local_40;
  connectdata *local_38;
  
  local_38 = data->conn;
  pMVar4 = (data->req).p.mqtt;
  cVar1 = local_38->sock[0];
  pcVar5 = (data->state).buffer;
  *done = false;
  local_40 = done;
  if (pMVar4->nsend != 0) {
    buf = pMVar4->sendleftovers;
    CVar9 = mqtt_send(data,buf,pMVar4->nsend);
    (*Curl_cfree)(buf);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
  }
  pcVar6 = local_38;
  Curl_infof(data,"mqtt_doing: state [%d]",(ulong)(local_38->proto).smbc.state);
  switch((pcVar6->proto).smbc.state) {
  case SMB_NOT_CONNECTED:
    CVar9 = Curl_read(data,cVar1,(char *)&pMVar4->firstbyte,1,(ssize_t *)&local_48);
    if (local_48 == 0) break;
    Curl_debug(data,CURLINFO_HEADER_IN,(char *)&pMVar4->firstbyte,1);
    pMVar4->npacket = 0;
    (data->conn->proto).smbc.state = SMB_CONNECTING;
  case SMB_CONNECTING:
    do {
      CVar10 = Curl_read(data,cVar1,(char *)&local_4b,1,(ssize_t *)&local_48);
      if (local_48 == 0) {
        bVar14 = true;
        goto LAB_0012fbeb;
      }
      Curl_debug(data,CURLINFO_HEADER_IN,(char *)&local_4b,1);
      sVar12 = pMVar4->npacket;
      pMVar4->npacket = sVar12 + 1;
      pcVar5[sVar12] = local_4b;
    } while (((char)local_4b < '\0') && (pMVar4->npacket < 4));
    bVar14 = local_48 == 0;
LAB_0012fbeb:
    CVar9 = CURLE_WEIRD_SERVER_REPLY;
    if (-1 < (char)local_4b) {
      CVar9 = CVar10;
    }
    if (bVar14) {
      CVar9 = CVar10;
    }
    if (CVar9 == CURLE_OK) {
      if (pMVar4->npacket == 0) {
        pMVar4->remaining_length = 0;
      }
      else {
        uVar11 = 1;
        sVar12 = 0;
        lVar13 = 1;
        do {
          bVar8 = pcVar5[uVar11 - 1];
          sVar12 = (ulong)(bVar8 & 0x7f) * lVar13 + sVar12;
          if (pMVar4->npacket <= uVar11) break;
          lVar13 = lVar13 << 7;
          uVar11 = uVar11 + 1;
        } while ((char)bVar8 < '\0');
        pMVar4->remaining_length = sVar12;
        pMVar4->npacket = 0;
        if (sVar12 != 0) {
          sVar2 = (local_38->proto).mqtt.nextstate;
          pcVar6 = data->conn;
          (pcVar6->proto).smbc.state = sVar2;
          if (sVar2 != SMB_NOT_CONNECTED) {
            return CURLE_OK;
          }
          (pcVar6->proto).mqtt.nextstate = MQTT_NOSTATE;
          return CURLE_OK;
        }
      }
      (data->conn->proto).ftpc.pp.cache = (char *)0x0;
      if (pMVar4->firstbyte != 0xe0) {
        return CURLE_OK;
      }
      Curl_infof(data,"Got DISCONNECT");
LAB_0012fabf:
      *local_40 = true;
      return CURLE_OK;
    }
    break;
  case SMB_NEGOTIATE:
    CVar9 = Curl_read(data,data->conn->sock[0],(char *)&local_4b,2,(ssize_t *)&local_48);
    if (CVar9 == CURLE_OK) {
      Curl_debug(data,CURLINFO_HEADER_IN,(char *)&local_4b,local_48);
      CVar9 = CURLE_WEIRD_SERVER_REPLY;
      if (1 < (long)local_48) {
        if (local_4b == 0 && local_4a == 0) {
          if ((data->state).httpreq == HTTPREQ_POST) {
            CVar9 = mqtt_publish(data);
            if (CVar9 == CURLE_OK) {
              CVar9 = mqtt_send(data,anon_var_dwarf_b665a,2);
              *local_40 = true;
            }
            (local_38->proto).mqtt.nextstate = MQTT_FIRST;
          }
          else {
            CVar9 = mqtt_subscribe(data);
            if (CVar9 == CURLE_OK) {
              (data->conn->proto).ftpc.pp.cache = (char *)0x300000000;
              return CURLE_OK;
            }
          }
        }
        else {
          Curl_failf(data,"Expected %02x%02x but got %02x%02x",0,0,(ulong)local_4b,(ulong)local_4a);
        }
      }
    }
    break;
  case SMB_SETUP:
  case SMB_CONNECTED|SMB_CONNECTING:
  case SMB_CONNECTED|SMB_NEGOTIATE:
    pcVar6 = data->conn;
    sVar2 = (pcVar6->proto).smbc.state;
    CVar9 = CURLE_WEIRD_SERVER_REPLY;
    if (3 < sVar2 - SMB_SETUP) break;
    cVar1 = pcVar6->sock[0];
    pcVar5 = (data->state).buffer;
    pSVar7 = (data->req).p.smtp;
    switch(sVar2) {
    default:
      bVar8 = pSVar7->rcpt_had_ok & 0xf0;
      if (bVar8 == 0xe0) {
        CVar9 = CURLE_OK;
        Curl_infof(data,"Got DISCONNECT");
        *local_40 = true;
        goto LAB_0012fea0;
      }
      if (bVar8 == 0x90) {
        (pcVar6->proto).smbc.state = SMB_CONNECTED;
        goto switchD_0012f9a4_caseD_4;
      }
      if (bVar8 != 0x30) goto LAB_0012fea0;
      (pcVar6->proto).smbc.state = SMB_CONNECTED|SMB_NEGOTIATE;
      size = (curl_slist *)pSVar7->eob;
      Curl_infof(data,"Remaining length: %zd bytes",size);
      lVar13 = (data->set).max_filesize;
      if (lVar13 != 0 && lVar13 < (long)size) {
        Curl_failf(data,"Maximum file size exceeded");
        CVar9 = CURLE_FILESIZE_EXCEEDED;
        goto LAB_0012fea0;
      }
      Curl_pgrsSetDownloadSize(data,(curl_off_t)size);
      (data->req).bytecount = 0;
      (data->req).size = (curl_off_t)size;
      pSVar7->rcpt = size;
      break;
    case SMB_CONNECTED:
switchD_0012f9a4_caseD_4:
      CVar9 = Curl_read(data,cVar1,(char *)&local_4b,3,(ssize_t *)&local_48);
      if (CVar9 == CURLE_OK) {
        Curl_debug(data,CURLINFO_HEADER_IN,(char *)&local_4b,local_48);
        CVar9 = CURLE_WEIRD_SERVER_REPLY;
        if ((((2 < (long)local_48) &&
             (uVar3 = (pcVar6->proto).mqtt.packetid, local_4b == (byte)(uVar3 >> 8))) &&
            (local_4a == (byte)uVar3)) && (local_49 == '\0')) {
          (data->conn->proto).ftpc.pp.cache = (char *)0x500000000;
          CVar9 = CURLE_OK;
        }
      }
      goto LAB_0012fea0;
    case SMB_CONNECTED|SMB_NEGOTIATE:
      size = pSVar7->rcpt;
    }
    sizerequested = (curl_slist *)(data->set).buffer_size;
    if (size < sizerequested) {
      sizerequested = size;
    }
    CVar9 = Curl_read(data,cVar1,pcVar5,(size_t)sizerequested,(ssize_t *)&local_48);
    if (CVar9 == CURLE_OK) {
      if (local_48 == 0) {
        Curl_infof(data,"server disconnected");
        CVar9 = CURLE_PARTIAL_FILE;
      }
      else {
        Curl_debug(data,CURLINFO_DATA_IN,pcVar5,local_48);
        pSVar7->rcpt = (curl_slist *)((long)pSVar7->rcpt - local_48);
        lVar13 = local_48 + (data->req).bytecount;
        (data->req).bytecount = lVar13;
        Curl_pgrsSetDownloadCounter(data,lVar13);
        CVar9 = Curl_client_write(data,1,pcVar5,local_48);
        if ((CVar9 == CURLE_OK) && (CVar9 = CURLE_OK, pSVar7->rcpt == (curl_slist *)0x0)) {
          (data->conn->proto).ftpc.pp.cache = (char *)0x500000000;
        }
      }
    }
    else if (CVar9 == CURLE_AGAIN) {
      Curl_infof(data,"EEEE AAAAGAIN");
      CVar9 = CURLE_AGAIN;
    }
    break;
  default:
    Curl_failf(data,"State not handled yet");
    goto LAB_0012fabf;
  }
LAB_0012fea0:
  CVar10 = CURLE_OK;
  if (CVar9 != CURLE_AGAIN) {
    CVar10 = CVar9;
  }
  return CVar10;
}

Assistant:

static CURLcode mqtt_doing(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct mqtt_conn *mqtt = &conn->proto.mqtt;
  struct MQTT *mq = data->req.p.mqtt;
  ssize_t nread;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  unsigned char *pkt = (unsigned char *)data->state.buffer;
  unsigned char byte;

  *done = FALSE;

  if(mq->nsend) {
    /* send the remainder of an outgoing packet */
    char *ptr = mq->sendleftovers;
    result = mqtt_send(data, mq->sendleftovers, mq->nsend);
    free(ptr);
    if(result)
      return result;
  }

  infof(data, "mqtt_doing: state [%d]", (int) mqtt->state);
  switch(mqtt->state) {
  case MQTT_FIRST:
    /* Read the initial byte only */
    result = Curl_read(data, sockfd, (char *)&mq->firstbyte, 1, &nread);
    if(!nread)
      break;
    Curl_debug(data, CURLINFO_HEADER_IN, (char *)&mq->firstbyte, 1);
    /* remember the first byte */
    mq->npacket = 0;
    mqstate(data, MQTT_REMAINING_LENGTH, MQTT_NOSTATE);
    /* FALLTHROUGH */
  case MQTT_REMAINING_LENGTH:
    do {
      result = Curl_read(data, sockfd, (char *)&byte, 1, &nread);
      if(!nread)
        break;
      Curl_debug(data, CURLINFO_HEADER_IN, (char *)&byte, 1);
      pkt[mq->npacket++] = byte;
    } while((byte & 0x80) && (mq->npacket < 4));
    if(nread && (byte & 0x80))
      /* MQTT supports up to 127 * 128^0 + 127 * 128^1 + 127 * 128^2 +
         127 * 128^3 bytes. server tried to send more */
      result = CURLE_WEIRD_SERVER_REPLY;
    if(result)
      break;
    mq->remaining_length = mqtt_decode_len(&pkt[0], mq->npacket, NULL);
    mq->npacket = 0;
    if(mq->remaining_length) {
      mqstate(data, mqtt->nextstate, MQTT_NOSTATE);
      break;
    }
    mqstate(data, MQTT_FIRST, MQTT_FIRST);

    if(mq->firstbyte == MQTT_MSG_DISCONNECT) {
      infof(data, "Got DISCONNECT");
      *done = TRUE;
    }
    break;
  case MQTT_CONNACK:
    result = mqtt_verify_connack(data);
    if(result)
      break;

    if(data->state.httpreq == HTTPREQ_POST) {
      result = mqtt_publish(data);
      if(!result) {
        result = mqtt_disconnect(data);
        *done = TRUE;
      }
      mqtt->nextstate = MQTT_FIRST;
    }
    else {
      result = mqtt_subscribe(data);
      if(!result) {
        mqstate(data, MQTT_FIRST, MQTT_SUBACK);
      }
    }
    break;

  case MQTT_SUBACK:
  case MQTT_PUBWAIT:
  case MQTT_PUB_REMAIN:
    result = mqtt_read_publish(data, done);
    break;

  default:
    failf(data, "State not handled yet");
    *done = TRUE;
    break;
  }

  if(result == CURLE_AGAIN)
    result = CURLE_OK;
  return result;
}